

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DriveStrengthSyntax::setChild
          (DriveStrengthSyntax *this,size_t index,TokenOrSyntax child)

{
  Token *pTVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  logic_error *this_00;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index < 5) {
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar2 = pvVar6->info;
    pTVar1 = &this->openParen + index;
    pTVar1->kind = pvVar6->kind;
    pTVar1->field_0x2 = uVar3;
    pTVar1->numFlags = (NumericTokenFlags)NVar4.raw;
    pTVar1->rawLen = uVar5;
    pTVar1->info = pIVar2;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
             ,"");
  plVar7 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar7;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar7[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
  }
  local_b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x128d);
  std::operator+(&local_50,&local_b0,&local_70);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar7;
  plVar9 = plVar7 + 2;
  if (local_90 == plVar9) {
    local_80 = *plVar9;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar9;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_f0 = (long *)*plVar7;
  plVar9 = plVar7 + 2;
  if (local_f0 == plVar9) {
    local_e0 = *plVar9;
    lStack_d8 = plVar7[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar9;
  }
  local_e8 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DriveStrengthSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: strength0 = child.token(); return;
        case 2: comma = child.token(); return;
        case 3: strength1 = child.token(); return;
        case 4: closeParen = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}